

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

QMultiMap<QByteArray,_int> __thiscall Generator::automaticPropertyMetaTypesHelper(Generator *this)

{
  uint uVar1;
  PropertyDef *pPVar2;
  bool bVar3;
  ClassDef *pCVar4;
  char *pcVar5;
  long lVar6;
  QByteArray *propertyType;
  Generator *in_RSI;
  long in_FS_OFFSET;
  QStringBuilder<const_char_*,_const_QByteArray_&> local_68;
  QByteArray local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->parser = (Moc *)0x0;
  local_3c = 0;
  pCVar4 = in_RSI->cdef;
  if (0 < (int)(pCVar4->propertyList).d.size) {
    do {
      lVar6 = (long)local_3c;
      pPVar2 = (pCVar4->propertyList).d.ptr;
      propertyType = &pPVar2[lVar6].type;
      bVar3 = registerableMetaType(in_RSI,propertyType);
      if (bVar3) {
        bVar3 = isBuiltinType(propertyType);
        if (!bVar3) {
          uVar1 = pPVar2[lVar6].typeTag.super_QFlagsStorageHelper<TypeTag,_4>.
                  super_QFlagsStorage<TypeTag>.i;
          if ((uVar1 & 4) == 0) {
            local_68.a = "class ";
            if ((uVar1 & 2) == 0) {
              local_68.a = "struct ";
              pcVar5 = "";
LAB_0010ed7c:
              if ((uVar1 & 1) == 0) {
                local_68.a = pcVar5;
              }
            }
          }
          else {
            local_68.a = "enum class ";
            if ((uVar1 & 2) == 0) {
              local_68.a = "enum struct ";
              pcVar5 = "enum ";
              goto LAB_0010ed7c;
            }
          }
          local_68.b = propertyType;
          QStringBuilder<const_char_*,_const_QByteArray_&>::convertTo<QByteArray>
                    (&local_58,&local_68);
          QMultiMap<QByteArray,_int>::insert((QMultiMap<QByteArray,_int> *)this,&local_58,&local_3c)
          ;
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
      }
      local_3c = local_3c + 1;
      pCVar4 = in_RSI->cdef;
    } while (local_3c < (int)(pCVar4->propertyList).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::multimap<QByteArray,_int,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_int>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMultiMap<QByteArray, int> Generator::automaticPropertyMetaTypesHelper()
{
    QMultiMap<QByteArray, int> automaticPropertyMetaTypes;
    for (int i = 0; i < int(cdef->propertyList.size()); ++i) {
        const PropertyDef &p = cdef->propertyList.at(i);
        const QByteArray &propertyType = p.type;
        if (registerableMetaType(propertyType) && !isBuiltinType(propertyType))
            automaticPropertyMetaTypes.insert(cxxTypeTag(p.typeTag) + propertyType, i);
    }
    return automaticPropertyMetaTypes;
}